

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quantize_x86_avx512.cpp
# Opt level: O2

int __thiscall
ncnn::Quantize_x86_avx512::forward
          (Quantize_x86_avx512 *this,Mat *bottom_blob,Mat *top_blob,Option *opt)

{
  int elempack;
  uint _w;
  uint _h;
  size_t sVar1;
  void *pvVar2;
  void *pvVar3;
  size_t sVar4;
  size_t sVar5;
  size_t sVar6;
  uint uVar7;
  int iVar8;
  Mat *pMVar9;
  byte bVar10;
  int iVar11;
  long lVar12;
  int *piVar13;
  int *piVar14;
  ulong uVar15;
  long lVar16;
  Mat *pMVar17;
  Mat *pMVar18;
  ulong uVar19;
  ulong uVar20;
  long lVar21;
  bool bVar22;
  Mat local_b8;
  ulong local_70;
  Mat *local_68;
  Mat *local_60;
  size_t local_58;
  ulong local_50;
  ulong local_48;
  size_t local_40;
  int local_34;
  
  elempack = bottom_blob->elempack;
  iVar8 = bottom_blob->dims;
  _w = bottom_blob->w;
  local_70 = (ulong)_w;
  _h = bottom_blob->h;
  pMVar9 = (Mat *)(ulong)_h;
  local_58 = (size_t)elempack;
  local_40 = 8;
  local_60 = bottom_blob;
  if (iVar8 == 3) {
    local_48 = (ulong)(uint)bottom_blob->c;
    uVar7 = elempack * bottom_blob->c;
    bVar10 = (uVar7 & 7) == 0 & opt->use_packing_layout;
    if (bVar10 == 0) {
      local_40 = 1;
    }
    Mat::create(top_blob,_w,_h,(int)uVar7 / (int)local_40,local_40,(int)local_40,opt->blob_allocator
               );
    if (top_blob->data == (void *)0x0) {
      return -100;
    }
    if ((long)top_blob->c * top_blob->cstep == 0) {
      return -100;
    }
    if (bVar10 == 1 && elempack == 0x10) {
      local_34 = _h * (int)local_70;
      lVar16 = 0;
      local_50 = 0;
      if (0 < (int)local_48) {
        local_50 = local_48 & 0xffffffff;
      }
      lVar12 = 0;
      local_68 = top_blob;
      for (uVar19 = 0; top_blob = local_68, local_50 != uVar19; uVar19 = uVar19 + 1) {
        sVar1 = bottom_blob->cstep;
        sVar6 = bottom_blob->elemsize;
        sVar4 = local_68->cstep;
        pvVar2 = local_68->data;
        sVar5 = local_68->elemsize;
        pvVar3 = bottom_blob->data;
        if ((this->super_Quantize).scale_data_size < 2) {
          piVar14 = (this->super_Quantize).scale_data.refcount;
          local_b8.data = (this->super_Quantize).scale_data.data;
          piVar13 = (this->super_Quantize).scale_data.refcount;
          local_b8.elemsize = (this->super_Quantize).scale_data.elemsize;
          local_b8.elempack = (this->super_Quantize).scale_data.elempack;
          local_b8.allocator = (this->super_Quantize).scale_data.allocator;
          local_b8.dims = (this->super_Quantize).scale_data.dims;
          local_b8.w = (this->super_Quantize).scale_data.w;
          local_b8.h = (this->super_Quantize).scale_data.h;
          local_b8.d = (this->super_Quantize).scale_data.d;
          local_b8.c = (this->super_Quantize).scale_data.c;
          local_b8.cstep = (this->super_Quantize).scale_data.cstep;
          local_b8.refcount = piVar13;
          if (piVar14 == (int *)0x0) goto LAB_003f94ef;
          LOCK();
          *piVar14 = *piVar14 + 1;
          UNLOCK();
        }
        else {
          local_b8.elemsize = (this->super_Quantize).scale_data.elemsize;
          local_b8.data =
               (void *)(local_b8.elemsize * lVar12 + (long)(this->super_Quantize).scale_data.data);
          local_b8.elempack = (this->super_Quantize).scale_data.elempack;
          local_b8.allocator = (this->super_Quantize).scale_data.allocator;
          local_b8.refcount = (int *)0x0;
          local_b8.dims = 1;
          local_b8.w = 0x10;
          local_b8.h = 1;
          local_b8.d = 1;
          local_b8.c = 1;
          local_b8.cstep = 0x10;
LAB_003f94ef:
          piVar13 = (int *)0x0;
        }
        quantize_pack16to8((float *)(sVar1 * uVar19 * sVar6 + (long)pvVar3),
                           (char *)(sVar4 * lVar16 * sVar5 + (long)pvVar2),
                           (char *)((lVar16 + 1) * sVar4 * sVar5 + (long)pvVar2),&local_b8,local_34)
        ;
        if (piVar13 != (int *)0x0) {
          LOCK();
          *piVar13 = *piVar13 + -1;
          UNLOCK();
          if (*piVar13 == 0) {
            if (local_b8.allocator == (Allocator *)0x0) {
              free(local_b8.data);
            }
            else {
              (*(local_b8.allocator)->_vptr_Allocator[3])();
            }
          }
        }
        lVar12 = lVar12 + 0x10;
        lVar16 = lVar16 + 2;
      }
    }
    if (elempack == 4 && bVar10 == 0) {
      local_68 = (Mat *)CONCAT44(local_68._4_4_,_h * (int)local_70);
      lVar16 = 0;
      uVar19 = 0;
      if (0 < (int)local_48) {
        uVar19 = local_48 & 0xffffffff;
      }
      for (uVar20 = 0; uVar19 != uVar20; uVar20 = uVar20 + 1) {
        sVar1 = bottom_blob->cstep;
        sVar6 = bottom_blob->elemsize;
        sVar4 = top_blob->cstep;
        pvVar2 = top_blob->data;
        sVar5 = top_blob->elemsize;
        local_b8.data = (this->super_Quantize).scale_data.data;
        pvVar3 = bottom_blob->data;
        if ((this->super_Quantize).scale_data_size < 2) {
          piVar14 = (this->super_Quantize).scale_data.refcount;
          local_b8.elemsize = (this->super_Quantize).scale_data.elemsize;
          local_b8.elempack = (this->super_Quantize).scale_data.elempack;
          local_b8.allocator = (this->super_Quantize).scale_data.allocator;
          local_b8.dims = (this->super_Quantize).scale_data.dims;
          local_b8.w = (this->super_Quantize).scale_data.w;
          local_b8.h = (this->super_Quantize).scale_data.h;
          local_b8.d = (this->super_Quantize).scale_data.d;
          local_b8.c = (this->super_Quantize).scale_data.c;
          local_b8.cstep = (this->super_Quantize).scale_data.cstep;
          local_b8.refcount = piVar14;
          if (piVar14 == (int *)0x0) goto LAB_003f9b88;
          LOCK();
          *piVar14 = *piVar14 + 1;
          UNLOCK();
        }
        else {
          local_b8.elemsize = (this->super_Quantize).scale_data.elemsize;
          local_b8.data = (void *)((long)local_b8.data + local_b8.elemsize * lVar16);
          local_b8.elempack = (this->super_Quantize).scale_data.elempack;
          local_b8.allocator = (this->super_Quantize).scale_data.allocator;
          local_b8.refcount = (int *)0x0;
          local_b8.dims = 1;
          local_b8.w = 4;
          local_b8.h = 1;
          local_b8.d = 1;
          local_b8.c = 1;
          local_b8.cstep = 4;
LAB_003f9b88:
          piVar14 = (int *)0x0;
        }
        quantize_pack4to1((float *)(sVar1 * uVar20 * sVar6 + (long)pvVar3),
                          (char *)(sVar4 * lVar16 * sVar5 + (long)pvVar2),
                          (char *)((lVar16 + 1) * sVar4 * sVar5 + (long)pvVar2),
                          (char *)((lVar16 + 2) * sVar4 * sVar5 + (long)pvVar2),
                          (char *)((lVar16 + 3) * sVar4 * sVar5 + (long)pvVar2),&local_b8,
                          (int)local_68);
        if (piVar14 != (int *)0x0) {
          LOCK();
          *piVar14 = *piVar14 + -1;
          UNLOCK();
          if (*piVar14 == 0) {
            if (local_b8.allocator == (Allocator *)0x0) {
              free(local_b8.data);
            }
            else {
              (*(local_b8.allocator)->_vptr_Allocator[3])();
            }
          }
        }
        lVar16 = lVar16 + 4;
        bottom_blob = local_60;
      }
    }
    if (elempack != (int)local_40) {
      return 0;
    }
    iVar8 = _h * (int)local_70;
    uVar19 = local_48 & 0xffffffff;
    if ((int)local_48 < 1) {
      uVar19 = 0;
    }
    lVar16 = 0;
    for (uVar20 = 0; uVar19 != uVar20; uVar20 = uVar20 + 1) {
      sVar1 = local_60->cstep;
      sVar6 = local_60->elemsize;
      pvVar2 = local_60->data;
      sVar4 = top_blob->cstep;
      sVar5 = top_blob->elemsize;
      pvVar3 = top_blob->data;
      if ((this->super_Quantize).scale_data_size < 2) {
        piVar14 = (this->super_Quantize).scale_data.refcount;
        local_b8.data = (this->super_Quantize).scale_data.data;
        local_b8.refcount = (this->super_Quantize).scale_data.refcount;
        local_b8.elemsize = (this->super_Quantize).scale_data.elemsize;
        local_b8.elempack = (this->super_Quantize).scale_data.elempack;
        local_b8.allocator = (this->super_Quantize).scale_data.allocator;
        local_b8.dims = (this->super_Quantize).scale_data.dims;
        local_b8.w = (this->super_Quantize).scale_data.w;
        local_b8.h = (this->super_Quantize).scale_data.h;
        local_b8.d = (this->super_Quantize).scale_data.d;
        local_b8.c = (this->super_Quantize).scale_data.c;
        local_b8.cstep = (this->super_Quantize).scale_data.cstep;
        if (piVar14 == (int *)0x0) {
          piVar14 = (int *)0x0;
        }
        else {
          LOCK();
          *piVar14 = *piVar14 + 1;
          UNLOCK();
          piVar14 = local_b8.refcount;
        }
      }
      else {
        local_b8.elemsize = (this->super_Quantize).scale_data.elemsize;
        local_b8.data =
             (void *)(local_b8.elemsize * lVar16 + (long)(this->super_Quantize).scale_data.data);
        local_b8.elempack = (this->super_Quantize).scale_data.elempack;
        local_b8.allocator = (this->super_Quantize).scale_data.allocator;
        local_b8.refcount = (int *)0x0;
        local_b8.c = 1;
        local_b8.w = elempack;
        local_b8.dims = 1;
        local_b8.h = 1;
        local_b8.d = 1;
        local_b8.cstep = local_58;
        piVar14 = (int *)0x0;
      }
      quantize((float *)(sVar1 * uVar20 * sVar6 + (long)pvVar2),
               (char *)(sVar4 * uVar20 * sVar5 + (long)pvVar3),&local_b8,iVar8,elempack);
      if (piVar14 != (int *)0x0) {
        LOCK();
        *piVar14 = *piVar14 + -1;
        UNLOCK();
        if (*piVar14 == 0) {
          if (local_b8.allocator == (Allocator *)0x0) {
            free(local_b8.data);
          }
          else {
            (*(local_b8.allocator)->_vptr_Allocator[3])();
          }
        }
      }
      lVar16 = lVar16 + local_58;
    }
    return 0;
  }
  if (iVar8 == 2) {
    bVar10 = (elempack * _h & 7) == 0 & opt->use_packing_layout;
    local_50 = CONCAT71(local_50._1_7_,bVar10);
    if (bVar10 == 0) {
      local_40 = 1;
    }
    Mat::create(top_blob,_w,(int)(elempack * _h) / (int)local_40,local_40,(int)local_40,
                opt->blob_allocator);
    if (top_blob->data == (void *)0x0) {
      return -100;
    }
    if ((long)top_blob->c * top_blob->cstep == 0) {
      return -100;
    }
    if ((char)local_50 == '\x01' && elempack == 0x10) {
      lVar16 = 0;
      local_68 = (Mat *)0x0;
      if (0 < (int)_h) {
        local_68 = pMVar9;
      }
      pMVar17 = (Mat *)0x0;
      for (pMVar18 = (Mat *)0x0; local_68 != pMVar18; pMVar18 = (Mat *)((long)&pMVar18->data + 1)) {
        iVar8 = bottom_blob->w;
        sVar1 = bottom_blob->elemsize;
        pvVar2 = top_blob->data;
        lVar12 = (long)top_blob->w * top_blob->elemsize;
        pvVar3 = bottom_blob->data;
        if ((this->super_Quantize).scale_data_size < 2) {
          piVar14 = (this->super_Quantize).scale_data.refcount;
          local_b8.data = (this->super_Quantize).scale_data.data;
          piVar13 = (this->super_Quantize).scale_data.refcount;
          local_b8.elemsize = (this->super_Quantize).scale_data.elemsize;
          local_b8.elempack = (this->super_Quantize).scale_data.elempack;
          local_b8.allocator = (this->super_Quantize).scale_data.allocator;
          local_b8.dims = (this->super_Quantize).scale_data.dims;
          local_b8.w = (this->super_Quantize).scale_data.w;
          local_b8.h = (this->super_Quantize).scale_data.h;
          local_b8.d = (this->super_Quantize).scale_data.d;
          local_b8.c = (this->super_Quantize).scale_data.c;
          local_b8.cstep = (this->super_Quantize).scale_data.cstep;
          local_b8.refcount = piVar13;
          if (piVar14 == (int *)0x0) goto LAB_003f92c0;
          LOCK();
          *piVar14 = *piVar14 + 1;
          UNLOCK();
        }
        else {
          local_b8.elemsize = (this->super_Quantize).scale_data.elemsize;
          local_b8.data =
               (void *)(local_b8.elemsize * (long)pMVar17 +
                       (long)(this->super_Quantize).scale_data.data);
          local_b8.elempack = (this->super_Quantize).scale_data.elempack;
          local_b8.allocator = (this->super_Quantize).scale_data.allocator;
          local_b8.refcount = (int *)0x0;
          local_b8.dims = 1;
          local_b8.w = 0x10;
          local_b8.h = 1;
          local_b8.d = 1;
          local_b8.c = 1;
          local_b8.cstep = 0x10;
LAB_003f92c0:
          piVar13 = (int *)0x0;
        }
        local_60 = pMVar17;
        quantize_pack16to8((float *)((long)iVar8 * (long)pMVar18 * sVar1 + (long)pvVar3),
                           (char *)(lVar12 * lVar16 + (long)pvVar2),
                           (char *)((lVar16 + 1) * lVar12 + (long)pvVar2),&local_b8,(int)local_70);
        if (piVar13 != (int *)0x0) {
          LOCK();
          *piVar13 = *piVar13 + -1;
          UNLOCK();
          if (*piVar13 == 0) {
            if (local_b8.allocator == (Allocator *)0x0) {
              free(local_b8.data);
            }
            else {
              (*(local_b8.allocator)->_vptr_Allocator[3])();
            }
          }
        }
        pMVar17 = (Mat *)&local_60->elemsize;
        lVar16 = lVar16 + 2;
      }
    }
    if (elempack == 4 && (char)local_50 == '\0') {
      lVar16 = 0;
      local_60 = (Mat *)0x0;
      if (0 < (int)_h) {
        local_60 = pMVar9;
      }
      for (pMVar17 = (Mat *)0x0; local_60 != pMVar17; pMVar17 = (Mat *)((long)&pMVar17->data + 1)) {
        iVar8 = bottom_blob->w;
        sVar1 = bottom_blob->elemsize;
        pvVar2 = top_blob->data;
        lVar12 = (long)top_blob->w * top_blob->elemsize;
        local_b8.data = (this->super_Quantize).scale_data.data;
        pvVar3 = bottom_blob->data;
        if ((this->super_Quantize).scale_data_size < 2) {
          piVar14 = (this->super_Quantize).scale_data.refcount;
          local_b8.elemsize = (this->super_Quantize).scale_data.elemsize;
          local_b8.elempack = (this->super_Quantize).scale_data.elempack;
          local_b8.allocator = (this->super_Quantize).scale_data.allocator;
          local_b8.dims = (this->super_Quantize).scale_data.dims;
          local_b8.w = (this->super_Quantize).scale_data.w;
          local_b8.h = (this->super_Quantize).scale_data.h;
          local_b8.d = (this->super_Quantize).scale_data.d;
          local_b8.c = (this->super_Quantize).scale_data.c;
          local_b8.cstep = (this->super_Quantize).scale_data.cstep;
          local_b8.refcount = piVar14;
          if (piVar14 == (int *)0x0) goto LAB_003f99f5;
          LOCK();
          *piVar14 = *piVar14 + 1;
          UNLOCK();
        }
        else {
          local_b8.elemsize = (this->super_Quantize).scale_data.elemsize;
          local_b8.data = (void *)((long)local_b8.data + local_b8.elemsize * lVar16);
          local_b8.elempack = (this->super_Quantize).scale_data.elempack;
          local_b8.allocator = (this->super_Quantize).scale_data.allocator;
          local_b8.refcount = (int *)0x0;
          local_b8.dims = 1;
          local_b8.w = 4;
          local_b8.h = 1;
          local_b8.d = 1;
          local_b8.c = 1;
          local_b8.cstep = 4;
LAB_003f99f5:
          piVar14 = (int *)0x0;
        }
        quantize_pack4to1((float *)((long)iVar8 * (long)pMVar17 * sVar1 + (long)pvVar3),
                          (char *)(lVar12 * lVar16 + (long)pvVar2),
                          (char *)((lVar16 + 1) * lVar12 + (long)pvVar2),
                          (char *)((lVar16 + 2) * lVar12 + (long)pvVar2),
                          (char *)((lVar16 + 3) * lVar12 + (long)pvVar2),&local_b8,(int)local_70);
        if (piVar14 != (int *)0x0) {
          LOCK();
          *piVar14 = *piVar14 + -1;
          UNLOCK();
          if (*piVar14 == 0) {
            if (local_b8.allocator == (Allocator *)0x0) {
              free(local_b8.data);
            }
            else {
              (*(local_b8.allocator)->_vptr_Allocator[3])();
            }
          }
        }
        lVar16 = lVar16 + 4;
      }
    }
    if (elempack != (int)local_40) {
      return 0;
    }
    if ((int)_h < 1) {
      pMVar9 = (Mat *)0x0;
    }
    lVar16 = 0;
    for (pMVar17 = (Mat *)0x0; pMVar9 != pMVar17; pMVar17 = (Mat *)((long)&pMVar17->data + 1)) {
      iVar8 = bottom_blob->w;
      sVar1 = bottom_blob->elemsize;
      pvVar2 = bottom_blob->data;
      iVar11 = top_blob->w;
      sVar6 = top_blob->elemsize;
      pvVar3 = top_blob->data;
      if ((this->super_Quantize).scale_data_size < 2) {
        piVar14 = (this->super_Quantize).scale_data.refcount;
        local_b8.data = (this->super_Quantize).scale_data.data;
        local_b8.refcount = (this->super_Quantize).scale_data.refcount;
        local_b8.elemsize = (this->super_Quantize).scale_data.elemsize;
        local_b8.elempack = (this->super_Quantize).scale_data.elempack;
        local_b8.allocator = (this->super_Quantize).scale_data.allocator;
        local_b8.dims = (this->super_Quantize).scale_data.dims;
        local_b8.w = (this->super_Quantize).scale_data.w;
        local_b8.h = (this->super_Quantize).scale_data.h;
        local_b8.d = (this->super_Quantize).scale_data.d;
        local_b8.c = (this->super_Quantize).scale_data.c;
        local_b8.cstep = (this->super_Quantize).scale_data.cstep;
        if (piVar14 == (int *)0x0) {
          piVar14 = (int *)0x0;
        }
        else {
          LOCK();
          *piVar14 = *piVar14 + 1;
          UNLOCK();
          piVar14 = local_b8.refcount;
        }
      }
      else {
        local_b8.elemsize = (this->super_Quantize).scale_data.elemsize;
        local_b8.data =
             (void *)(local_b8.elemsize * lVar16 + (long)(this->super_Quantize).scale_data.data);
        local_b8.elempack = (this->super_Quantize).scale_data.elempack;
        local_b8.allocator = (this->super_Quantize).scale_data.allocator;
        local_b8.refcount = (int *)0x0;
        local_b8.c = 1;
        local_b8.w = elempack;
        local_b8.dims = 1;
        local_b8.h = 1;
        local_b8.d = 1;
        local_b8.cstep = local_58;
        piVar14 = (int *)0x0;
      }
      quantize((float *)((long)iVar8 * (long)pMVar17 * sVar1 + (long)pvVar2),
               (char *)((long)iVar11 * (long)pMVar17 * sVar6 + (long)pvVar3),&local_b8,(int)local_70
               ,elempack);
      if (piVar14 != (int *)0x0) {
        LOCK();
        *piVar14 = *piVar14 + -1;
        UNLOCK();
        if (*piVar14 == 0) {
          if (local_b8.allocator == (Allocator *)0x0) {
            free(local_b8.data);
          }
          else {
            (*(local_b8.allocator)->_vptr_Allocator[3])();
          }
        }
      }
      lVar16 = lVar16 + local_58;
    }
  }
  else {
    if (iVar8 != 1) {
      return 0;
    }
    if (opt->use_packing_layout == false) {
      local_40 = 1;
    }
    if ((elempack * _w & 7) != 0) {
      local_40 = 1;
    }
    Mat::create(top_blob,(int)(elempack * _w) / (int)local_40,local_40,(int)local_40,
                opt->blob_allocator);
    if (top_blob->data == (void *)0x0) {
      return -100;
    }
    if ((long)top_blob->c * top_blob->cstep == 0) {
      return -100;
    }
    uVar19 = (long)((ulong)(uint)((int)local_70 >> 0x1f) << 0x20 | local_70 & 0xffffffff) /
             (long)opt->num_threads;
    if ((int)uVar19 < 2) {
      uVar19 = 1;
    }
    iVar8 = (int)uVar19;
    uVar20 = (long)((int)local_70 + iVar8 + -1) / (long)iVar8;
    uVar15 = uVar20 & 0xffffffff;
    if ((int)uVar20 < 1) {
      uVar15 = 0;
    }
    local_58 = local_58 * (uVar19 & 0xffffffff);
    lVar16 = local_58 * 4;
    lVar12 = 0;
    lVar21 = 0;
    local_68 = top_blob;
    while (bVar22 = uVar15 != 0, uVar15 = uVar15 - 1, bVar22) {
      iVar11 = (int)local_70;
      uVar20 = local_70 & 0xffffffff;
      if (iVar8 < iVar11) {
        uVar20 = uVar19 & 0xffffffff;
      }
      quantize((float *)((long)bottom_blob->data + lVar21),(char *)((long)local_68->data + lVar12),
               &(this->super_Quantize).scale_data,(int)uVar20 * elempack,1);
      lVar21 = lVar21 + lVar16;
      lVar12 = lVar12 + local_58;
      local_70 = (ulong)(uint)-(iVar8 - iVar11);
      bottom_blob = local_60;
    }
  }
  return 0;
}

Assistant:

int Quantize_x86_avx512::forward(const Mat& bottom_blob, Mat& top_blob, const Option& opt) const
{
    const int dims = bottom_blob.dims;
    const int w = bottom_blob.w;
    const int h = bottom_blob.h;
    const int channels = bottom_blob.c;
    const int elempack = bottom_blob.elempack;

    if (dims == 1)
    {
        int out_elempack = 1;
#if __SSE2__
        if (opt.use_packing_layout)
        {
            out_elempack = w * elempack % 8 == 0 ? 8 : 1;
        }
#endif
        const int outw = w * elempack / out_elempack;
        const size_t out_elemsize = out_elempack * 1u;

        top_blob.create(outw, out_elemsize, out_elempack, opt.blob_allocator);
        if (top_blob.empty())
            return -100;

        const int wp = std::max(1, w / opt.num_threads);
        const int nn_w = (w + wp - 1) / wp;

        #pragma omp parallel for num_threads(opt.num_threads)
        for (int ii = 0; ii < nn_w; ii++)
        {
            const int i = ii * wp;

            const float* ptr = (const float*)bottom_blob + i * elempack;
            signed char* s8ptr = (signed char*)top_blob + i * elempack;

            // assert scale_data_size == 1

            const int size = std::min(w - i, wp) * elempack;

            quantize(ptr, s8ptr, scale_data, size, 1);
        }
    }

    if (dims == 2)
    {
        int out_elempack = 1;
#if __SSE2__
        if (opt.use_packing_layout)
        {
            out_elempack = h * elempack % 8 == 0 ? 8 : 1;
        }
#endif
        const int outh = h * elempack / out_elempack;
        const size_t out_elemsize = out_elempack * 1u;

        top_blob.create(w, outh, out_elemsize, out_elempack, opt.blob_allocator);
        if (top_blob.empty())
            return -100;

#if __SSE2__
#if __AVX512F__
        if (elempack == 16 && out_elempack == 8)
        {
            #pragma omp parallel for num_threads(opt.num_threads)
            for (int i = 0; i < h; i++)
            {
                const float* ptr = bottom_blob.row(i);
                signed char* s8ptr0 = top_blob.row<signed char>(i * 2);
                signed char* s8ptr1 = top_blob.row<signed char>(i * 2 + 1);

                const Mat scale_data_i = scale_data_size > 1 ? scale_data.range(i * elempack, elempack) : scale_data;

                quantize_pack16to8(ptr, s8ptr0, s8ptr1, scale_data_i, w);
            }
        }
#endif // __AVX512F__
#if !__AVX__
        if (elempack == 4 && out_elempack == 8)
        {
            #pragma omp parallel for num_threads(opt.num_threads)
            for (int i = 0; i < outh; i++)
            {
                const float* ptr0 = bottom_blob.row(i * 2);
                const float* ptr1 = bottom_blob.row(i * 2 + 1);
                signed char* s8ptr = top_blob.row<signed char>(i);

                const Mat scale_data_i = scale_data_size > 1 ? scale_data.range(i * out_elempack, out_elempack) : scale_data;

                quantize_pack4to8(ptr0, ptr1, s8ptr, scale_data_i, w);
            }
        }
#endif // !__AVX__
        if (elempack == 4 && out_elempack == 1)
        {
            #pragma omp parallel for num_threads(opt.num_threads)
            for (int i = 0; i < h; i++)
            {
                const float* ptr = bottom_blob.row(i);
                signed char* s8ptr0 = top_blob.row<signed char>(i * 4);
                signed char* s8ptr1 = top_blob.row<signed char>(i * 4 + 1);
                signed char* s8ptr2 = top_blob.row<signed char>(i * 4 + 2);
                signed char* s8ptr3 = top_blob.row<signed char>(i * 4 + 3);

                const Mat scale_data_i = scale_data_size > 1 ? scale_data.range(i * elempack, elempack) : scale_data;

                quantize_pack4to1(ptr, s8ptr0, s8ptr1, s8ptr2, s8ptr3, scale_data_i, w);
            }
        }
#endif // __SSE2__
        if (elempack == out_elempack)
        {
            #pragma omp parallel for num_threads(opt.num_threads)
            for (int i = 0; i < h; i++)
            {
                const float* ptr = bottom_blob.row(i);
                signed char* s8ptr = top_blob.row<signed char>(i);

                const Mat scale_data_i = scale_data_size > 1 ? scale_data.range(i * elempack, elempack) : scale_data;

                quantize(ptr, s8ptr, scale_data_i, w, elempack);
            }
        }
    }

    if (dims == 3)
    {
        int out_elempack = 1;
#if __SSE2__
        if (opt.use_packing_layout)
        {
            out_elempack = channels * elempack % 8 == 0 ? 8 : 1;
        }
#endif
        const int outc = channels * elempack / out_elempack;
        const size_t out_elemsize = out_elempack * 1u;

        top_blob.create(w, h, outc, out_elemsize, out_elempack, opt.blob_allocator);
        if (top_blob.empty())
            return -100;

#if __SSE2__
#if __AVX512F__
        if (elempack == 16 && out_elempack == 8)
        {
            #pragma omp parallel for num_threads(opt.num_threads)
            for (int q = 0; q < channels; q++)
            {
                const float* ptr = bottom_blob.channel(q);
                signed char* s8ptr0 = top_blob.channel(q * 2);
                signed char* s8ptr1 = top_blob.channel(q * 2 + 1);

                const Mat scale_data_q = scale_data_size > 1 ? scale_data.range(q * elempack, elempack) : scale_data;

                quantize_pack16to8(ptr, s8ptr0, s8ptr1, scale_data_q, w * h);
            }
        }
#endif // __AVX512F__
#if !__AVX__
        if (elempack == 4 && out_elempack == 8)
        {
            #pragma omp parallel for num_threads(opt.num_threads)
            for (int q = 0; q < outc; q++)
            {
                const float* ptr0 = bottom_blob.channel(q * 2);
                const float* ptr1 = bottom_blob.channel(q * 2 + 1);
                signed char* s8ptr = top_blob.channel(q);

                const Mat scale_data_q = scale_data_size > 1 ? scale_data.range(q * out_elempack, out_elempack) : scale_data;

                quantize_pack4to8(ptr0, ptr1, s8ptr, scale_data_q, w * h);
            }
        }
#endif // !__AVX__
        if (elempack == 4 && out_elempack == 1)
        {
            #pragma omp parallel for num_threads(opt.num_threads)
            for (int q = 0; q < channels; q++)
            {
                const float* ptr = bottom_blob.channel(q);
                signed char* s8ptr0 = top_blob.channel(q * 4);
                signed char* s8ptr1 = top_blob.channel(q * 4 + 1);
                signed char* s8ptr2 = top_blob.channel(q * 4 + 2);
                signed char* s8ptr3 = top_blob.channel(q * 4 + 3);

                const Mat scale_data_q = scale_data_size > 1 ? scale_data.range(q * elempack, elempack) : scale_data;

                quantize_pack4to1(ptr, s8ptr0, s8ptr1, s8ptr2, s8ptr3, scale_data_q, w * h);
            }
        }
#endif // __SSE2__
        if (elempack == out_elempack)
        {
            #pragma omp parallel for num_threads(opt.num_threads)
            for (int q = 0; q < channels; q++)
            {
                const float* ptr = bottom_blob.channel(q);
                signed char* s8ptr = top_blob.channel(q);

                const Mat scale_data_q = scale_data_size > 1 ? scale_data.range(q * elempack, elempack) : scale_data;

                quantize(ptr, s8ptr, scale_data_q, w * h, elempack);
            }
        }
    }

    return 0;
}